

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::replace_sick_merchant_by_chest(World *world)

{
  Map *pMVar1;
  Entity *pEVar2;
  Position *pPVar3;
  Attributes local_60;
  World *local_10;
  World *world_local;
  
  local_10 = world;
  pMVar1 = World::map(world,0x2ba);
  Map::base_chest_id(pMVar1,'\x0e');
  pMVar1 = World::map(local_10,0x2ba);
  Map::remove_entity(pMVar1,'\0',true);
  pMVar1 = World::map(local_10,0x2ba);
  pEVar2 = (Entity *)operator_new(0x58);
  local_60.type_id = '\x12';
  Position::Position(&local_60.position,'\x0e','\x12','\0',false,false,false);
  local_60.orientation = '\x03';
  local_60.palette = '\x02';
  local_60.speed = '\0';
  local_60.fightable = false;
  local_60.liftable = false;
  local_60.can_pass_through = false;
  local_60.appear_after_player_moved_away = false;
  local_60.gravity_immune = false;
  local_60.talkable = false;
  local_60.dialogue = '\0';
  local_60.behavior_id = 0;
  local_60.entity_to_use_tiles_from = (Entity *)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_60.mask_flags);
  Flag::Flag(&local_60.persistence_flag,0xff,0xff);
  local_60.flag_unknown_2_3 = false;
  local_60.flag_unknown_2_4 = false;
  local_60.flag_unknown_3_5 = false;
  Entity::Entity(pEVar2,&local_60);
  Map::add_entity(pMVar1,pEVar2);
  Entity::Attributes::~Attributes(&local_60);
  pMVar1 = World::map(local_10,0x2ba);
  pEVar2 = Map::entity(pMVar1,'\0');
  pPVar3 = Entity::position(pEVar2);
  pPVar3->y = '\x15';
  return;
}

Assistant:

static void replace_sick_merchant_by_chest(World& world)
    {
        // Set the index for added chest in map to "0E" instead of "C2"
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->base_chest_id(0x0E);

        // Remove the sick merchant
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->remove_entity(0);

        // Add a chest
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->add_entity(new Entity({
                                                                                     .type_id = ENTITY_CHEST,
                                                                                     .position = Position(14, 18, 0),
                                                                                     .orientation = ENTITY_ORIENTATION_NW,
                                                                                     .palette = 2
                                                                             }));

        // Move the kid to hide the fact that the bed looks broken af
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->entity(0)->position().y = 21;

//   Bed tile GFX swap?
//   rom.set_word(0x0050B4, 0x0008); // Before: 0x2A0C (bit 4 of 102A) | After: 0x0008 (bit 0 of 1000 - always true)
    }